

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

void __thiscall SAT::cEnqueue(SAT *this,Lit p,Reason r)

{
  char cVar1;
  char *pcVar2;
  Lit LVar3;
  uint uVar4;
  Clause *pCVar5;
  char cVar6;
  Lit local_1c;
  anon_union_8_2_743a5d44_for_Reason_0 local_18;
  
  LVar3.x = ::lit_False.x;
  uVar4 = p.x >> 1;
  pcVar2 = (this->assigns).data;
  cVar1 = pcVar2[uVar4];
  cVar6 = -cVar1;
  if ((p.x & 1U) == 0) {
    cVar6 = cVar1;
  }
  local_1c.x = p.x;
  local_18 = r.field_0;
  if (cVar6 != ::l_False.value) {
    pcVar2[uVar4] = -((byte)p.x & 1) | 1;
    (this->trailpos).data[uVar4] = engine.trail.sz;
    (this->reason).data[uVar4].field_0 = r.field_0;
    vec<Lit>::push((this->trail).data + ((this->trail).sz - 1),&local_1c);
    return;
  }
  if ((so.lazy) && (r.field_0 != (Clause *)0x0)) {
    pCVar5 = getConfl(this,(Reason *)&local_18,p);
    this->confl = pCVar5;
    if (0xff < *(uint *)pCVar5) {
      pCVar5->data[0].x = p.x;
      return;
    }
  }
  else {
    pCVar5 = this->short_confl;
    uVar4 = *(uint *)pCVar5;
    if ((0xff < uVar4) && (pCVar5->data[0].x = ::lit_False.x, 0x1ff < uVar4)) {
      *(int *)(pCVar5 + 1) = LVar3.x;
      this->confl = pCVar5;
      return;
    }
  }
  abort();
}

Assistant:

void SAT::cEnqueue(Lit p, Reason r) {
	/* if (so.debug) { */
	/*   std::cerr << "c-enqueue literal " << getLitString(toInt(p)) << " because " << showReason(r)
	 * << "\n"; */
	/* } */
	assert(value(p) != l_True);
	const int v = var(p);
	if (value(p) == l_False) {
		if (so.lazy) {
			if (r == nullptr) {
				assert(decisionLevel() == 0);
				setConfl();
			} else {
				confl = getConfl(r, p);
				(*confl)[0] = p;
			}
		} else {
			setConfl();
		}
		return;
	}
	assigns[v] = toInt(lbool(!sign(p)));
	trailpos[v] = engine.trailPos();
	reason[v] = r;
	trail.last().push(p);
}